

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O0

void __thiscall miniros::observer::Connection::Connection(Connection *this,Connection *other)

{
  long in_RSI;
  Connection *in_RDI;
  scoped_lock<miniros::observer::impl::Connections> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  in_RDI->_vptr_Connection = (_func_int **)&PTR__Connection_0061de00;
  if (*(long *)(in_RSI + 8) != 0) {
    std::scoped_lock<miniros::observer::impl::Connections>::scoped_lock
              ((scoped_lock<miniros::observer::impl::Connections> *)in_RDI,in_stack_ffffffffffffffd8
              );
    in_RDI->m_prev = (Connection *)*(mutex_type **)(in_RSI + 0x10);
    in_RDI->m_next = (Connection *)*(mutex_type **)(in_RSI + 0x18);
    if ((mutex_type *)in_RDI->m_prev != (mutex_type *)0x0) {
      *(Connection **)((long)&((mutex_type *)in_RDI->m_prev)->m_root + 0x10) = in_RDI;
    }
    if (in_RDI->m_next != (Connection *)0x0) {
      in_RDI->m_next->m_prev = in_RDI;
    }
    in_RDI->m_container = *(Connections **)(in_RSI + 8);
    std::scoped_lock<miniros::observer::impl::Connections>::~scoped_lock
              ((scoped_lock<miniros::observer::impl::Connections> *)0x41f20d);
  }
  *(undefined8 *)(in_RSI + 8) = 0;
  *(undefined8 *)(in_RSI + 0x18) = 0;
  *(undefined8 *)(in_RSI + 0x10) = 0;
  return;
}

Assistant:

Connection::Connection(Connection&& other) {
    if (other.m_container) {
        std::scoped_lock<impl::Connections> lock(*other.m_container);

        m_prev = other.m_prev;
        m_next = other.m_next;

        if (m_prev) {
            m_prev->m_next = this;
        }
        if (m_next) {
            m_next->m_prev = this;
        }
        m_container = other.m_container;
    }

    other.m_container = nullptr;
    other.m_next = nullptr;
    other.m_prev = nullptr;
}